

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O1

bool compress_streaming(ilzham *lzham_dll,char *pSrc_filename,char *pDst_filename,
                       comp_options *options)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  lzham_compress_status_t lVar4;
  lzham_uint32 lVar5;
  FILE *__stream;
  FILE *__stream_00;
  ulong uVar6;
  void *__ptr;
  lzham_uint8 *plVar7;
  timer_ticks tVar8;
  lzham_compress_state_ptr pvVar9;
  timer_ticks tVar10;
  size_t sVar11;
  __off64_t _Var12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  long lVar16;
  size_t __n;
  uint uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  size_t out_num_bytes;
  size_t num_in_bytes;
  size_t local_88;
  timer_ticks local_80;
  lzham_uint8 *local_78;
  ulong local_70;
  lzham_compress_params local_68;
  undefined1 local_48 [16];
  ulong local_38;
  
  puts("Testing: Streaming compression");
  __stream = fopen64(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar15 = "Unable to read file: %s\n";
    pDst_filename = pSrc_filename;
  }
  else {
    __stream_00 = fopen64(pDst_filename,"wb");
    if (__stream_00 != (FILE *)0x0) {
      lVar16 = 0;
      fseeko64(__stream,0,2);
      uVar6 = ftello64(__stream);
      fseeko64(__stream,0,0);
      fputc(0x4c,__stream_00);
      fputc(0x5a,__stream_00);
      fputc(0x48,__stream_00);
      fputc(0x30,__stream_00);
      fputc(options->m_dict_size_log2,__stream_00);
      do {
        fputc((uint)(uVar6 >> ((byte)lVar16 & 0x3f)) & 0xff,__stream_00);
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0x40);
      __ptr = (void *)memalign(0x10,0x40000);
      plVar7 = (lzham_uint8 *)memalign(0x10,0x40000);
      if ((__ptr == (void *)0x0) || (plVar7 == (lzham_uint8 *)0x0)) {
        pcVar15 = "Out of memory!\n";
      }
      else {
        local_80 = timer::get_ticks();
        local_68.m_struct_size = 0x1c;
        local_68.m_max_helper_threads = options->m_max_helper_threads;
        uVar1 = options->m_comp_level;
        uVar2 = options->m_dict_size_log2;
        local_68.m_compress_flags = (lzham_uint32)(options->m_force_polar_codes == true);
        if (options->m_extreme_parsing == true) {
          local_68.m_compress_flags = local_68.m_compress_flags | 2;
        }
        if (options->m_deterministic_parsing == true) {
          local_68.m_compress_flags = local_68.m_compress_flags | 4;
        }
        local_68.m_cpucache_total_lines = 0;
        local_68.m_cpucache_line_size = 0;
        local_68.m_dict_size_log2 = uVar2;
        local_68.m_level = uVar1;
        tVar8 = timer::get_ticks();
        pvVar9 = (*lzham_dll->lzham_compress_init)(&local_68);
        tVar10 = timer::get_ticks();
        if (pvVar9 != (lzham_compress_state_ptr)0x0) {
          dVar18 = timer::ticks_to_secs(tVar10 - tVar8);
          printf("lzham_compress_init took %3.3fms\n",dVar18 * 1000.0);
          local_38 = uVar6 >> 1;
          uVar17 = 0;
          __n = 0;
          uVar13 = uVar6;
          local_78 = plVar7;
          do {
            if (uVar6 != 0) {
              tVar8 = timer::get_ticks();
              dVar18 = timer::ticks_to_secs(tVar8 - local_80);
              lVar16 = uVar6 - uVar13;
              auVar20._8_4_ = (int)((ulong)lVar16 >> 0x20);
              auVar20._0_8_ = lVar16;
              auVar20._12_4_ = 0x45300000;
              dVar21 = auVar20._8_8_ - 1.9342813113834067e+25;
              local_48._8_4_ = SUB84(dVar21,0);
              local_48._0_8_ =
                   (dVar21 + ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) /
                   dVar18;
              local_48._12_4_ = (int)((ulong)dVar21 >> 0x20);
              iVar14 = 0xf;
              do {
                printf("\b\b\b\b");
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
              printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec",
                     (double)((1.0 - (float)uVar13 / (float)uVar6) * 100.0),
                     (double)((float)uVar13 * 9.536743e-07),
                     -(uint)(0.0 < dVar18) & SUB84((double)local_48._0_8_ * 9.5367431640625e-07,0));
              printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
            }
            plVar7 = local_78;
            if (uVar17 == (uint)__n) {
              __n = 0x40000;
              if (uVar13 < 0x40000) {
                __n = uVar13;
              }
              sVar11 = fread(__ptr,1,__n,__stream);
              if (sVar11 != __n) {
                putchar(10);
                print_error("Failure reading from source file!\n");
                free(__ptr);
                free(plVar7);
                fclose(__stream);
                fclose(__stream_00);
                (*lzham_dll->lzham_decompress_deinit)(pvVar9);
                return false;
              }
              uVar13 = uVar13 - __n;
              uVar17 = 0;
            }
            local_70 = (ulong)((int)__n - uVar17);
            local_88 = 0x40000;
            lVar4 = (*lzham_dll->lzham_compress)
                              (pvVar9,(lzham_uint8 *)((ulong)uVar17 + (long)__ptr),&local_70,plVar7,
                               &local_88,SUB14(uVar13 == 0,0));
            uVar17 = uVar17 + (int)local_70;
            if ((local_88 == 0) ||
               (sVar11 = fwrite(plVar7,1,local_88 & 0xffffffff,__stream_00), sVar11 == local_88)) {
              cVar3 = (LZHAM_COMP_STATUS_NEEDS_MORE_INPUT < lVar4) * '\x05';
            }
            else {
              putchar(10);
              print_error("Failure writing to destination file!\n");
              free(__ptr);
              free(plVar7);
              fclose(__stream);
              fclose(__stream_00);
              (*lzham_dll->lzham_decompress_deinit)(pvVar9);
              cVar3 = '\x01';
            }
          } while (cVar3 == '\0');
          if (cVar3 != '\x05') {
            return false;
          }
          iVar14 = 0xf;
          do {
            printf("\b\b\b\b    \b\b\b\b");
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
          lVar5 = (*lzham_dll->lzham_compress_deinit)(pvVar9);
          tVar10 = timer::get_ticks();
          tVar8 = 1;
          if (tVar10 - local_80 != 0) {
            tVar8 = tVar10 - local_80;
          }
          dVar18 = timer::ticks_to_secs(tVar8);
          local_48._0_8_ = dVar18;
          _Var12 = ftello64(__stream_00);
          free(__ptr);
          free(local_78);
          fclose(__stream);
          fclose(__stream_00);
          if (lVar4 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
            if (uVar13 + ((int)__n - uVar17) == 0) {
              puts("Success");
              printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",uVar6,
                     _Var12);
              auVar19._8_4_ = (int)(uVar6 >> 0x20);
              auVar19._0_8_ = uVar6;
              auVar19._12_4_ = 0x45300000;
              auVar22._8_4_ = (int)((ulong)_Var12 >> 0x20);
              auVar22._0_8_ = _Var12;
              auVar22._12_4_ = 0x45300000;
              printf("Compression time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n"
                     ,local_48._0_8_,
                     ((auVar19._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) /
                     (double)local_48._0_8_,
                     SUB84(((auVar22._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)_Var12) - 4503599627370496.0)) /
                           (double)local_48._0_8_,0));
              printf("Input file adler32: 0x%08X\n",lVar5);
              return true;
            }
            print_error("Compressor failed to consume entire input file!\n");
            return false;
          }
          print_error("Compression failed with status %i\n",(ulong)lVar4);
          return false;
        }
        pcVar15 = "Failed initializing compressor!\n";
      }
      print_error(pcVar15);
      free(__ptr);
      free(plVar7);
      fclose(__stream);
      fclose(__stream_00);
      return false;
    }
    pcVar15 = "Unable to create file: %s\n";
  }
  print_error(pcVar15,pDst_filename);
  return false;
}

Assistant:

static bool compress_streaming(ilzham &lzham_dll, const char* pSrc_filename, const char *pDst_filename, const comp_options &options)
{
   printf("Testing: Streaming compression\n");

   FILE *pInFile = fopen(pSrc_filename, "rb");
   if (!pInFile)
   {
      print_error("Unable to read file: %s\n", pSrc_filename);
      return false;
   }

   FILE *pOutFile = fopen(pDst_filename, "wb");
   if (!pOutFile)
   {
      print_error("Unable to create file: %s\n", pDst_filename);
      return false;
   }

   _fseeki64(pInFile, 0, SEEK_END);
   uint64 src_file_size = _ftelli64(pInFile);
   _fseeki64(pInFile, 0, SEEK_SET);

   fputc('L', pOutFile);
   fputc('Z', pOutFile);
   fputc('H', pOutFile);
   fputc('0', pOutFile);
   fputc(options.m_dict_size_log2, pOutFile);

   for (uint i = 0; i < 8; i++)
   {
      fputc(static_cast<int>((src_file_size >> (i * 8)) & 0xFF), pOutFile);
   }

   const uint cInBufSize = LZHAMTEST_COMP_INPUT_BUFFER_SIZE;
   const uint cOutBufSize = LZHAMTEST_COMP_OUTPUT_BUFFER_SIZE;

   uint8 *in_file_buf = static_cast<uint8*>(_aligned_malloc(cInBufSize, 16));
   uint8 *out_file_buf = static_cast<uint8*>(_aligned_malloc(cOutBufSize, 16));
   if ((!in_file_buf) || (!out_file_buf))
   {
      print_error("Out of memory!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      return false;
   }

   uint64 src_bytes_left = src_file_size;

   uint in_file_buf_size = 0;
   uint in_file_buf_ofs = 0;

   uint64 total_output_bytes = 0;

   timer_ticks start_time = timer::get_ticks();

   lzham_compress_params params;
   memset(&params, 0, sizeof(params));
   params.m_struct_size = sizeof(lzham_compress_params);
   params.m_dict_size_log2 = options.m_dict_size_log2;
   params.m_max_helper_threads = options.m_max_helper_threads;
   params.m_level = options.m_comp_level;
   if (options.m_force_polar_codes)
   {
      params.m_compress_flags |= LZHAM_COMP_FLAG_FORCE_POLAR_CODING;
   }
   if (options.m_extreme_parsing)
   {
      params.m_compress_flags |= LZHAM_COMP_FLAG_EXTREME_PARSING;
   }
   if (options.m_deterministic_parsing)
   {
      params.m_compress_flags |= LZHAM_COMP_FLAG_DETERMINISTIC_PARSING;
   }
   params.m_cpucache_line_size = 0;
   params.m_cpucache_total_lines = 0;

   timer_ticks init_start_time = timer::get_ticks();
   lzham_compress_state_ptr pComp_state = lzham_dll.lzham_compress_init(&params);
   timer_ticks total_init_time = timer::get_ticks() - init_start_time;

   if (!pComp_state)
   {
      print_error("Failed initializing compressor!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      return false;
   }

   printf("lzham_compress_init took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

   lzham_compress_status_t status;
   for ( ; ; )
   {
      if (src_file_size)
      {
         double total_elapsed_time = timer::ticks_to_secs(timer::get_ticks() - start_time);
         double total_bytes_processed = static_cast<double>(src_file_size - src_bytes_left);
         double comp_rate = (total_elapsed_time > 0.0f) ? total_bytes_processed / total_elapsed_time : 0.0f;

         for (int i = 0; i < 15; i++)
            printf("\b\b\b\b");
         printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec", (1.0f - (static_cast<float>(src_bytes_left) / src_file_size)) * 100.0f, src_bytes_left / 1048576.0f, comp_rate / (1024.0f * 1024.0f));
         printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
      }

      if (in_file_buf_ofs == in_file_buf_size)
      {
         in_file_buf_size = static_cast<uint>(my_min(cInBufSize, src_bytes_left));

         if (fread(in_file_buf, 1, in_file_buf_size, pInFile) != in_file_buf_size)
         {
            printf("\n");
            print_error("Failure reading from source file!\n");
            _aligned_free(in_file_buf);
            _aligned_free(out_file_buf);
            fclose(pInFile);
            fclose(pOutFile);
            lzham_dll.lzham_decompress_deinit(pComp_state);
            return false;
         }

         src_bytes_left -= in_file_buf_size;

         in_file_buf_ofs = 0;
      }

      uint8 *pIn_bytes = &in_file_buf[in_file_buf_ofs];
      size_t num_in_bytes = in_file_buf_size - in_file_buf_ofs;
      uint8* pOut_bytes = out_file_buf;
      size_t out_num_bytes = cOutBufSize;

      status = lzham_dll.lzham_compress(pComp_state, pIn_bytes, &num_in_bytes, pOut_bytes, &out_num_bytes, src_bytes_left == 0);

      if (num_in_bytes)
      {
         in_file_buf_ofs += (uint)num_in_bytes;
         assert(in_file_buf_ofs <= in_file_buf_size);
      }

      if (out_num_bytes)
      {
         if (fwrite(out_file_buf, 1, static_cast<uint>(out_num_bytes), pOutFile) != out_num_bytes)
         {
            printf("\n");
            print_error("Failure writing to destination file!\n");
            _aligned_free(in_file_buf);
            _aligned_free(out_file_buf);
            fclose(pInFile);
            fclose(pOutFile);
            lzham_dll.lzham_decompress_deinit(pComp_state);
            return false;
         }

         total_output_bytes += out_num_bytes;
      }

      if ((status != LZHAM_COMP_STATUS_NOT_FINISHED) && (status != LZHAM_COMP_STATUS_NEEDS_MORE_INPUT))
         break;
   }

   for (int i = 0; i < 15; i++)
   {
      printf("\b\b\b\b    \b\b\b\b");
   }

   src_bytes_left += (in_file_buf_size - in_file_buf_ofs);

   uint32 adler32 = lzham_dll.lzham_compress_deinit(pComp_state);
   pComp_state = NULL;

   timer_ticks end_time = timer::get_ticks();
   double total_time = timer::ticks_to_secs(my_max(1, end_time - start_time));

   uint64 cmp_file_size = _ftelli64(pOutFile);

   _aligned_free(in_file_buf);
   in_file_buf = NULL;
   _aligned_free(out_file_buf);
   out_file_buf = NULL;

   fclose(pInFile);
   pInFile = NULL;
   fclose(pOutFile);
   pOutFile = NULL;

   if (status != LZHAM_COMP_STATUS_SUCCESS)
   {
      print_error("Compression failed with status %i\n", status);
      return false;
   }

   if (src_bytes_left)
   {
      print_error("Compressor failed to consume entire input file!\n");
      return false;
   }

   printf("Success\n");
   printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);
   printf("Compression time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_time, src_file_size / total_time, cmp_file_size / total_time);
   printf("Input file adler32: 0x%08X\n", adler32);

   return true;
}